

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

void hash_x64_128(void *key,int len,uint32_t seed,uint64_t *r_out)

{
  uint64_t uVar1;
  uint64_t uVar2;
  byte *pbVar3;
  long *in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint64_t *in_RDI;
  uint64_t k2_1;
  uint64_t k1_1;
  uint8_t *tail;
  uint64_t k2;
  uint64_t k1;
  int i;
  uint64_t *blocks;
  uint64_t c2;
  uint64_t c1;
  uint64_t h2;
  uint64_t h1;
  int nblocks;
  uint8_t *data;
  ulong local_80;
  ulong local_78;
  int local_54;
  ulong local_38;
  ulong local_30;
  
  local_30 = (ulong)in_EDX;
  local_38 = (ulong)in_EDX;
  for (local_54 = 0; local_54 < (int)in_ESI / 0x10; local_54 = local_54 + 1) {
    uVar1 = hash_get_block_64(in_RDI,local_54 << 1);
    uVar2 = hash_get_block_64(in_RDI,local_54 * 2 + 1);
    uVar1 = hash_rotl_64(uVar1 * -0x783c846eeebdac2b,'\x1f');
    uVar1 = hash_rotl_64(uVar1 * 0x4cf5ad432745937f ^ local_30,'\x1b');
    local_30 = (local_38 + uVar1) * 5 + 0x52dce729;
    uVar1 = hash_rotl_64(uVar2 * 0x4cf5ad432745937f,'!');
    uVar1 = hash_rotl_64(uVar1 * -0x783c846eeebdac2b ^ local_38,'\x1f');
    local_38 = (local_30 + uVar1) * 5 + 0x38495ab5;
  }
  pbVar3 = (byte *)((long)in_RDI + (long)((int)in_ESI / 0x10 << 4));
  local_78 = 0;
  local_80 = 0;
  switch(in_ESI & 0xf) {
  case 0xf:
    local_80 = (ulong)pbVar3[0xe] << 0x30;
  case 0xe:
    local_80 = (ulong)pbVar3[0xd] << 0x28 ^ local_80;
  case 0xd:
    local_80 = (ulong)pbVar3[0xc] << 0x20 ^ local_80;
  case 0xc:
    local_80 = (ulong)pbVar3[0xb] << 0x18 ^ local_80;
  case 0xb:
    local_80 = (ulong)pbVar3[10] << 0x10 ^ local_80;
  case 10:
    local_80 = (ulong)pbVar3[9] << 8 ^ local_80;
  case 9:
    uVar1 = hash_rotl_64((pbVar3[8] ^ local_80) * 0x4cf5ad432745937f,'!');
    local_38 = uVar1 * -0x783c846eeebdac2b ^ local_38;
  case 8:
    local_78 = (ulong)pbVar3[7] << 0x38;
  case 7:
    local_78 = (ulong)pbVar3[6] << 0x30 ^ local_78;
  case 6:
    local_78 = (ulong)pbVar3[5] << 0x28 ^ local_78;
  case 5:
    local_78 = (ulong)pbVar3[4] << 0x20 ^ local_78;
  case 4:
    local_78 = (ulong)pbVar3[3] << 0x18 ^ local_78;
  case 3:
    local_78 = (ulong)pbVar3[2] << 0x10 ^ local_78;
  case 2:
    local_78 = (ulong)pbVar3[1] << 8 ^ local_78;
  case 1:
    uVar1 = hash_rotl_64((*pbVar3 ^ local_78) * -0x783c846eeebdac2b,'\x1f');
    local_30 = uVar1 * 0x4cf5ad432745937f ^ local_30;
  default:
    uVar1 = ((long)(int)in_ESI ^ local_38) + ((long)(int)in_ESI ^ local_30);
    uVar2 = hash_fmix_64(uVar1);
    uVar1 = hash_fmix_64(uVar1 + ((long)(int)in_ESI ^ local_38));
    *in_RCX = uVar1 + uVar2;
    in_RCX[1] = uVar1 + uVar2 + uVar1;
    return;
  }
}

Assistant:

static inline void
hash_x64_128(const void *key, const int len, const uint32_t seed,
    uint64_t r_out[2]) {
	const uint8_t *data = (const uint8_t *) key;
	const int nblocks = len / 16;

	uint64_t h1 = seed;
	uint64_t h2 = seed;

	const uint64_t c1 = KQU(0x87c37b91114253d5);
	const uint64_t c2 = KQU(0x4cf5ad432745937f);

	/* body */
	{
		const uint64_t *blocks = (const uint64_t *) (data);
		int i;

		for (i = 0; i < nblocks; i++) {
			uint64_t k1 = hash_get_block_64(blocks, i*2 + 0);
			uint64_t k2 = hash_get_block_64(blocks, i*2 + 1);

			k1 *= c1; k1 = hash_rotl_64(k1, 31); k1 *= c2; h1 ^= k1;

			h1 = hash_rotl_64(h1, 27); h1 += h2;
			h1 = h1*5 + 0x52dce729;

			k2 *= c2; k2 = hash_rotl_64(k2, 33); k2 *= c1; h2 ^= k2;

			h2 = hash_rotl_64(h2, 31); h2 += h1;
			h2 = h2*5 + 0x38495ab5;
		}
	}

	/* tail */
	{
		const uint8_t *tail = (const uint8_t*)(data + nblocks*16);
		uint64_t k1 = 0;
		uint64_t k2 = 0;

		switch (len & 15) {
		case 15: k2 ^= ((uint64_t)(tail[14])) << 48; JEMALLOC_FALLTHROUGH;
		case 14: k2 ^= ((uint64_t)(tail[13])) << 40; JEMALLOC_FALLTHROUGH;
		case 13: k2 ^= ((uint64_t)(tail[12])) << 32; JEMALLOC_FALLTHROUGH;
		case 12: k2 ^= ((uint64_t)(tail[11])) << 24; JEMALLOC_FALLTHROUGH;
		case 11: k2 ^= ((uint64_t)(tail[10])) << 16; JEMALLOC_FALLTHROUGH;
		case 10: k2 ^= ((uint64_t)(tail[ 9])) << 8;  JEMALLOC_FALLTHROUGH;
		case  9: k2 ^= ((uint64_t)(tail[ 8])) << 0;
			k2 *= c2; k2 = hash_rotl_64(k2, 33); k2 *= c1; h2 ^= k2;
			JEMALLOC_FALLTHROUGH;
		case  8: k1 ^= ((uint64_t)(tail[ 7])) << 56; JEMALLOC_FALLTHROUGH;
		case  7: k1 ^= ((uint64_t)(tail[ 6])) << 48; JEMALLOC_FALLTHROUGH;
		case  6: k1 ^= ((uint64_t)(tail[ 5])) << 40; JEMALLOC_FALLTHROUGH;
		case  5: k1 ^= ((uint64_t)(tail[ 4])) << 32; JEMALLOC_FALLTHROUGH;
		case  4: k1 ^= ((uint64_t)(tail[ 3])) << 24; JEMALLOC_FALLTHROUGH;
		case  3: k1 ^= ((uint64_t)(tail[ 2])) << 16; JEMALLOC_FALLTHROUGH;
		case  2: k1 ^= ((uint64_t)(tail[ 1])) << 8;  JEMALLOC_FALLTHROUGH;
		case  1: k1 ^= ((uint64_t)(tail[ 0])) << 0;
			k1 *= c1; k1 = hash_rotl_64(k1, 31); k1 *= c2; h1 ^= k1;
			break;
		}
	}

	/* finalization */
	h1 ^= len; h2 ^= len;

	h1 += h2;
	h2 += h1;

	h1 = hash_fmix_64(h1);
	h2 = hash_fmix_64(h2);

	h1 += h2;
	h2 += h1;

	r_out[0] = h1;
	r_out[1] = h2;
}